

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t read_var_sized(archive_read *a,size_t *pvalue,size_t *pvalue_len)

{
  wchar_t wVar1;
  uint64_t *pvalue_len_00;
  uint64_t v_size;
  uint64_t v;
  uint64_t local_20;
  size_t local_18;
  
  local_20 = 0;
  if (pvalue_len == (size_t *)0x0) {
    pvalue_len_00 = (uint64_t *)0x0;
  }
  else {
    pvalue_len_00 = &local_20;
  }
  wVar1 = read_var(a,&local_18,pvalue_len_00);
  if (pvalue != (size_t *)0x0 && wVar1 != L'\0') {
    *pvalue = local_18;
  }
  if (pvalue_len != (size_t *)0x0) {
    *pvalue_len = local_20;
  }
  return wVar1;
}

Assistant:

static int read_var_sized(struct archive_read* a, size_t* pvalue,
    size_t* pvalue_len)
{
	uint64_t v;
	uint64_t v_size = 0;

	const int ret = pvalue_len ? read_var(a, &v, &v_size)
				   : read_var(a, &v, NULL);

	if(ret == 1 && pvalue) {
		*pvalue = (size_t) v;
	}

	if(pvalue_len) {
		/* Possible data truncation should be safe. */
		*pvalue_len = (size_t) v_size;
	}

	return ret;
}